

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void Prn_gen<Blob<224>>(int nbRn,pfHash hash,vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes)

{
  undefined1 auVar1 [16];
  Blob<224> h;
  value_type vStack_68;
  uint8_t local_48 [8];
  uint8_t auStack_40 [4];
  uint8_t auStack_3c [4];
  uint8_t auStack_38 [4];
  uint8_t auStack_34 [12];
  
  printf("Generating %i random numbers : \n",(ulong)(uint)nbRn);
  auVar1 = ZEXT816(0) << 0x40;
  auStack_38[0] = '\0';
  auStack_38[1] = '\0';
  auStack_38[2] = '\0';
  auStack_38[3] = '\0';
  auStack_34[0] = '\0';
  auStack_34[1] = '\0';
  auStack_34[2] = '\0';
  auStack_34[3] = '\0';
  auStack_34[4] = '\0';
  auStack_34[5] = '\0';
  auStack_34[6] = '\0';
  auStack_34[7] = '\0';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  auStack_40[0] = '\0';
  auStack_40[1] = '\0';
  auStack_40[2] = '\0';
  auStack_40[3] = '\0';
  auStack_3c[0] = '\0';
  auStack_3c[1] = '\0';
  auStack_3c[2] = '\0';
  auStack_3c[3] = '\0';
  if (0 < nbRn) {
    do {
      vStack_68.bytes[0x10] = '\0';
      vStack_68.bytes[0x11] = '\0';
      vStack_68.bytes[0x12] = '\0';
      vStack_68.bytes[0x13] = '\0';
      vStack_68.bytes._20_8_ = auVar1._8_8_;
      vStack_68.bytes[0] = '\0';
      vStack_68.bytes[1] = '\0';
      vStack_68.bytes[2] = '\0';
      vStack_68.bytes[3] = '\0';
      vStack_68.bytes[4] = '\0';
      vStack_68.bytes[5] = '\0';
      vStack_68.bytes[6] = '\0';
      vStack_68.bytes[7] = '\0';
      vStack_68.bytes._8_4_ = auVar1._8_4_;
      vStack_68.bytes._12_4_ = auVar1._12_4_;
      (*hash)(local_48,0x1c,0,&vStack_68);
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back(hashes,&vStack_68);
      auStack_34[0] = vStack_68.bytes[0x14];
      auStack_34[1] = vStack_68.bytes[0x15];
      auStack_34[2] = vStack_68.bytes[0x16];
      auStack_34[3] = vStack_68.bytes[0x17];
      auStack_34[4] = vStack_68.bytes[0x18];
      auStack_34[5] = vStack_68.bytes[0x19];
      auStack_34[6] = vStack_68.bytes[0x1a];
      auStack_34[7] = vStack_68.bytes[0x1b];
      nbRn = nbRn + -1;
      auStack_38[0] = vStack_68.bytes[0x10];
      auStack_38[1] = vStack_68.bytes[0x11];
      auStack_38[2] = vStack_68.bytes[0x12];
      auStack_38[3] = vStack_68.bytes[0x13];
      local_48[0] = vStack_68.bytes[0];
      local_48[1] = vStack_68.bytes[1];
      local_48[2] = vStack_68.bytes[2];
      local_48[3] = vStack_68.bytes[3];
      local_48[4] = vStack_68.bytes[4];
      local_48[5] = vStack_68.bytes[5];
      local_48[6] = vStack_68.bytes[6];
      local_48[7] = vStack_68.bytes[7];
      auStack_40[0] = vStack_68.bytes[8];
      auStack_40[1] = vStack_68.bytes[9];
      auStack_40[2] = vStack_68.bytes[10];
      auStack_40[3] = vStack_68.bytes[0xb];
      auStack_3c[0] = vStack_68.bytes[0xc];
      auStack_3c[1] = vStack_68.bytes[0xd];
      auStack_3c[2] = vStack_68.bytes[0xe];
      auStack_3c[3] = vStack_68.bytes[0xf];
      auVar1 = ZEXT816(0) << 0x20;
    } while (nbRn != 0);
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}